

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O1

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::Initialize(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  HeapAllocator *this_00;
  undefined4 *puVar5;
  EntryType **__s;
  DictionaryStats *pDVar6;
  size_t byteSize;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  this->disableResize = false;
  this->free = (EntryType *)0x0;
  data.plusSize = (size_t)this->size;
  local_50 = (undefined1  [8])&SimpleHashEntry<void*,Memory::Recycler::PinRecord>*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_2797d2f;
  data.filename._0_4_ = 0x41;
  this_00 = Memory::HeapAllocator::TrackAllocInfo(this->allocator,(TrackAllocData *)local_50);
  uVar1 = this->size;
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00728ef2;
    *puVar5 = 0;
  }
  byteSize = (ulong)uVar1 << 3;
  __s = (EntryType **)Memory::HeapAllocator::AllocT<false>(this_00,byteSize);
  memset(__s,0,byteSize);
  if (__s == (EntryType **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_00728ef2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this->table = __s;
  pDVar6 = DictionaryStats::Create
                     ("P15SimpleHashTableIPvN6Memory8Recycler9PinRecordENS1_13HeapAllocatorE15DefaultComparerLb1E11PrimePolicyE"
                      ,this->size);
  this->stats = pDVar6;
  return;
}

Assistant:

void Initialize()
    {
        disableResize = false;
        free = nullptr;
        table = AllocatorNewArrayZ(TAllocator, allocator, EntryType*, size);
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
    }